

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O2

void __thiscall AnalyzerDecl::~AnalyzerDecl(AnalyzerDecl *this)

{
  Function *this_00;
  Param *this_01;
  pointer ppSVar1;
  _Vector_base<StateVar_*,_std::allocator<StateVar_*>_> *this_02;
  _Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_> *this_03;
  _Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *p_Var2;
  _Vector_base<Function_*,_std::allocator<Function_*>_> *this_04;
  _Vector_base<Param_*,_std::allocator<Param_*>_> *this_05;
  pointer ppAVar3;
  pointer ppFVar4;
  pointer ppPVar5;
  pointer ppAVar6;
  
  (this->super_TypeDecl).super_Decl._vptr_Decl = (_func_int **)&PTR__AnalyzerDecl_0013fe20;
  this_02 = &this->statevars_->super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>;
  if (this_02 == (_Vector_base<StateVar_*,_std::allocator<StateVar_*>_> *)0x0) {
    this_02 = (_Vector_base<StateVar_*,_std::allocator<StateVar_*>_> *)0x0;
  }
  else {
    for (ppSVar1 = (((_Vector_base<StateVar_*,_std::allocator<StateVar_*>_> *)&this_02->_M_impl)->
                   _M_impl).super__Vector_impl_data._M_start;
        ppSVar1 != (this_02->_M_impl).super__Vector_impl_data._M_finish; ppSVar1 = ppSVar1 + 1) {
      operator_delete(*ppSVar1,0x10);
      this_02 = &this->statevars_->super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>;
    }
    std::_Vector_base<StateVar_*,_std::allocator<StateVar_*>_>::~_Vector_base(this_02);
  }
  operator_delete(this_02,0x18);
  this->statevars_ = (StateVarList *)0x0;
  this_03 = &this->actions_->super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>
  ;
  if (this_03 == (_Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_> *)0x0) {
    this_03 = (_Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_> *)0x0;
  }
  else {
    for (ppAVar3 = (((_Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_> *)
                    &this_03->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
        ppAVar3 != (this_03->_M_impl).super__Vector_impl_data._M_finish; ppAVar3 = ppAVar3 + 1) {
      if (*ppAVar3 != (AnalyzerAction *)0x0) {
        (*((*ppAVar3)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
        this_03 = &this->actions_->
                   super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>;
      }
    }
    std::_Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>::~_Vector_base(this_03);
  }
  operator_delete(this_03,0x18);
  this->actions_ = (AnalyzerActionList *)0x0;
  p_Var2 = &this->helpers_->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>;
  if (p_Var2 == (_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)0x0) {
    p_Var2 = (_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)0x0;
  }
  else {
    for (ppAVar6 = (((_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                    &p_Var2->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
        ppAVar6 != (p_Var2->_M_impl).super__Vector_impl_data._M_finish; ppAVar6 = ppAVar6 + 1) {
      if (*ppAVar6 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar6)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
        p_Var2 = &this->helpers_->
                  super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>;
      }
    }
    std::_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::~_Vector_base(p_Var2);
  }
  operator_delete(p_Var2,0x18);
  this->helpers_ = (AnalyzerHelperList *)0x0;
  this_04 = &this->functions_->super__Vector_base<Function_*,_std::allocator<Function_*>_>;
  if (this_04 == (_Vector_base<Function_*,_std::allocator<Function_*>_> *)0x0) {
    this_04 = (_Vector_base<Function_*,_std::allocator<Function_*>_> *)0x0;
  }
  else {
    for (ppFVar4 = (((_Vector_base<Function_*,_std::allocator<Function_*>_> *)&this_04->_M_impl)->
                   _M_impl).super__Vector_impl_data._M_start;
        ppFVar4 != (this_04->_M_impl).super__Vector_impl_data._M_finish; ppFVar4 = ppFVar4 + 1) {
      this_00 = *ppFVar4;
      if (this_00 != (Function *)0x0) {
        Function::~Function(this_00);
      }
      operator_delete(this_00,0x80);
      this_04 = &this->functions_->super__Vector_base<Function_*,_std::allocator<Function_*>_>;
    }
    std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base(this_04);
  }
  operator_delete(this_04,0x18);
  this->functions_ = (FunctionList *)0x0;
  this_05 = &((this->super_TypeDecl).params_)->super__Vector_base<Param_*,_std::allocator<Param_*>_>
  ;
  if (this_05 == (_Vector_base<Param_*,_std::allocator<Param_*>_> *)0x0) {
    this_05 = (_Vector_base<Param_*,_std::allocator<Param_*>_> *)0x0;
  }
  else {
    for (ppPVar5 = (((_Vector_base<Param_*,_std::allocator<Param_*>_> *)&this_05->_M_impl)->_M_impl)
                   .super__Vector_impl_data._M_start;
        ppPVar5 != (this_05->_M_impl).super__Vector_impl_data._M_finish; ppPVar5 = ppPVar5 + 1) {
      this_01 = *ppPVar5;
      if (this_01 != (Param *)0x0) {
        Param::~Param(this_01);
      }
      operator_delete(this_01,0x80);
      this_05 = &((this->super_TypeDecl).params_)->
                 super__Vector_base<Param_*,_std::allocator<Param_*>_>;
    }
    std::_Vector_base<Param_*,_std::allocator<Param_*>_>::~_Vector_base(this_05);
  }
  operator_delete(this_05,0x18);
  (this->super_TypeDecl).params_ = (ParamList *)0x0;
  p_Var2 = &this->constructor_helpers_->
            super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>;
  if (p_Var2 == (_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)0x0) {
    p_Var2 = (_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)0x0;
  }
  else {
    for (ppAVar6 = (((_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                    &p_Var2->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
        ppAVar6 != (p_Var2->_M_impl).super__Vector_impl_data._M_finish; ppAVar6 = ppAVar6 + 1) {
      if (*ppAVar6 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar6)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
        p_Var2 = &this->constructor_helpers_->
                  super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>;
      }
    }
    std::_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::~_Vector_base(p_Var2);
  }
  operator_delete(p_Var2,0x18);
  this->constructor_helpers_ = (AnalyzerHelperList *)0x0;
  p_Var2 = &this->destructor_helpers_->
            super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>;
  if (p_Var2 == (_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)0x0) {
    p_Var2 = (_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)0x0;
  }
  else {
    for (ppAVar6 = (((_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                    &p_Var2->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
        ppAVar6 != (p_Var2->_M_impl).super__Vector_impl_data._M_finish; ppAVar6 = ppAVar6 + 1) {
      if (*ppAVar6 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar6)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
        p_Var2 = &this->destructor_helpers_->
                  super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>;
      }
    }
    std::_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::~_Vector_base(p_Var2);
  }
  operator_delete(p_Var2,0x18);
  this->destructor_helpers_ = (AnalyzerHelperList *)0x0;
  p_Var2 = &this->eof_helpers_->
            super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>;
  if (p_Var2 == (_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)0x0) {
    p_Var2 = (_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)0x0;
  }
  else {
    for (ppAVar6 = (((_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                    &p_Var2->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
        ppAVar6 != (p_Var2->_M_impl).super__Vector_impl_data._M_finish; ppAVar6 = ppAVar6 + 1) {
      if (*ppAVar6 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar6)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
        p_Var2 = &this->eof_helpers_->
                  super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>;
      }
    }
    std::_Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::~_Vector_base(p_Var2);
  }
  operator_delete(p_Var2,0x18);
  this->eof_helpers_ = (AnalyzerHelperList *)0x0;
  TypeDecl::~TypeDecl(&this->super_TypeDecl);
  return;
}

Assistant:

AnalyzerDecl::~AnalyzerDecl()
	{
	delete_list(StateVarList, statevars_);
	delete_list(AnalyzerActionList, actions_);
	delete_list(AnalyzerHelperList, helpers_);
	delete_list(FunctionList, functions_);
	delete_list(ParamList, params_);
	delete_list(AnalyzerHelperList, constructor_helpers_);
	delete_list(AnalyzerHelperList, destructor_helpers_);
	delete_list(AnalyzerHelperList, eof_helpers_);
	}